

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_echo_server.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  StringArg ip;
  sz_pid_t v;
  int iVar2;
  int iVar3;
  LogStream *this;
  char **ppcVar4;
  int *in_FS_OFFSET;
  SourceFile file;
  undefined1 local_10c8 [8];
  EchoServer server;
  char *local_118 [4];
  undefined1 local_f8 [8];
  EventLoop loop;
  InetAddress listenAddr;
  
  sznet::sztool_memcheck();
  signal(2,StopSignal);
  signal(0xf,StopSignal);
  if (sznet::g_logLevel < 3) {
    file._8_8_ = 0x13;
    file.m_data = "tcp_echo_server.cpp";
    sznet::Logger::Logger((Logger *)local_10c8,file,0x81);
    if (6 < (uint)((int)local_118 - (int)local_118[0])) {
      builtin_strncpy(local_118[0],"pid = ",6);
      local_118[0] = local_118[0] + 6;
    }
    v = sznet::sz_getpid();
    this = sznet::LogStream::operator<<((LogStream *)&server,v);
    ppcVar4 = &(this->m_buffer).m_cur;
    pcVar1 = (this->m_buffer).m_cur;
    if (8 < (uint)((int)ppcVar4 - (int)pcVar1)) {
      builtin_strncpy(pcVar1,", tid = ",8);
      *ppcVar4 = *ppcVar4 + 8;
    }
    sznet::CurrentThread::t_cachedTid::__tls_init();
    if (*in_FS_OFFSET == 0) {
      sznet::CurrentThread::cacheTid();
    }
    sznet::CurrentThread::t_cachedTid::__tls_init();
    sznet::LogStream::operator<<(this,*in_FS_OFFSET);
    sznet::Logger::~Logger((Logger *)local_10c8);
  }
  if (argc < 5) {
    printf("Usage: %s ip port thread_num mode(1-echo, others-RTT)\n",*argv);
  }
  else {
    ip.m_str = argv[1];
    iVar2 = atoi(argv[2]);
    iVar3 = atoi(argv[3]);
    numThreads = 2;
    if (iVar3 != 0) {
      numThreads = iVar3;
    }
    iVar3 = atoi(argv[4]);
    sznet::net::EventLoop::EventLoop((EventLoop *)local_f8);
    g_pMainLoopsRun = (EventLoop *)local_f8;
    sznet::net::InetAddress::InetAddress
              ((InetAddress *)
               ((long)&loop.m_pendingFunctors.
                       super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),ip,(uint16_t)iVar2,
               false);
    EchoServer::EchoServer
              ((EchoServer *)local_10c8,(EventLoop *)local_f8,
               (InetAddress *)
               ((long)&loop.m_pendingFunctors.
                       super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),iVar3);
    EchoServer::start((EchoServer *)local_10c8);
    sznet::net::EventLoop::loop((EventLoop *)local_f8);
    if (server.m_codec.m_messageCallback.super__Function_base._M_functor._8_8_ != 0) {
      (*(code *)server.m_codec.m_messageCallback.super__Function_base._M_functor._8_8_)
                (&server.m_startTime,&server.m_startTime,3);
    }
    sznet::net::TcpServer::~TcpServer((TcpServer *)local_10c8);
    sznet::net::EventLoop::~EventLoop((EventLoop *)local_f8);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    sznet::sztool_memcheck();
#ifdef _WIN32
    static int block = 0;
    if (block)
    {
        _CrtSetBreakAlloc(block);
    }
#endif

    signal(SIGINT, StopSignal);
    signal(SIGTERM, StopSignal);

    LOG_INFO << "pid = " << sz_getpid() << ", tid = " << CurrentThread::tid();
    if (argc <= 4)
    {
        printf("Usage: %s ip port thread_num mode(1-echo, others-RTT)\n", argv[0]);
        return 0;
    }

    char* szSvrip = argv[1];
    uint16_t sSvrPort= static_cast<uint16_t>(atoi(argv[2]));
    numThreads = atoi(argv[3]);
    numThreads = (numThreads == 0 ? 2 : numThreads);
    int mode = atoi(argv[4]);

    EventLoop loop;
    g_pMainLoopsRun = &loop;
    InetAddress listenAddr(szSvrip, sSvrPort);
    EchoServer server(&loop, listenAddr, mode);

    server.start();

    loop.loop();

    return 0;
}